

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.c
# Opt level: O0

void queue_toplevel_callback(toplevel_callback_fn_t fn,void *ctx)

{
  callback *pcVar1;
  callback *pcVar2;
  callback *cb;
  void *ctx_local;
  toplevel_callback_fn_t fn_local;
  
  pcVar2 = (callback *)safemalloc(1,0x18,0);
  pcVar2->fn = fn;
  pcVar2->ctx = ctx;
  if (((notify_frontend != (toplevel_callback_notify_fn_t)0x0) && (cbhead == (callback *)0x0)) &&
     (cbcurr == (callback *)0x0)) {
    (*notify_frontend)(notify_ctx);
  }
  pcVar1 = pcVar2;
  if (cbtail != (callback *)0x0) {
    cbtail->next = pcVar2;
    pcVar1 = cbhead;
  }
  cbhead = pcVar1;
  cbtail = pcVar2;
  pcVar2->next = (callback *)0x0;
  return;
}

Assistant:

void queue_toplevel_callback(toplevel_callback_fn_t fn, void *ctx)
{
    struct callback *cb;

    cb = snew(struct callback);
    cb->fn = fn;
    cb->ctx = ctx;

    /*
     * If the front end has requested notification of pending
     * callbacks, and we didn't already have one queued, let it know
     * we do have one now.
     *
     * If cbcurr is non-NULL, i.e. we are actually in the middle of
     * executing a callback right now, then we count that as the queue
     * already having been non-empty. That saves the front end getting
     * a constant stream of needless re-notifications if the last
     * callback keeps re-scheduling itself.
     */
    if (notify_frontend && !cbhead && !cbcurr)
        notify_frontend(notify_ctx);

    if (cbtail)
        cbtail->next = cb;
    else
        cbhead = cb;
    cbtail = cb;
    cb->next = NULL;
}